

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O3

M44d * Imath_2_5::procrustesRotationAndTranslation<double>
                 (M44d *__return_storage_ptr__,Vec3<double> *A,Vec3<double> *B,double *weights,
                 size_t numPoints,bool doScale)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  double *pdVar5;
  size_t sVar6;
  double *pdVar7;
  int i_2;
  double (*V_00) [3];
  long lVar8;
  long lVar9;
  double (*A_00) [3];
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar19;
  undefined1 auVar18 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  M33d Qt;
  V3d S;
  M33d U;
  M33d C;
  M33d V;
  double local_1d8 [10];
  double local_188;
  double dStack_180;
  undefined1 local_178 [16];
  Vec3<double> local_168;
  Matrix33<double> local_150;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double dStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  
  if (numPoints == 0) {
    __return_storage_ptr__->x[1][1] = 0.0;
    __return_storage_ptr__->x[1][2] = 0.0;
    __return_storage_ptr__->x[2][1] = 0.0;
    __return_storage_ptr__->x[2][2] = 0.0;
    __return_storage_ptr__->x[3][1] = 0.0;
    __return_storage_ptr__->x[3][2] = 0.0;
    __return_storage_ptr__->x[2][3] = 0.0;
    __return_storage_ptr__->x[3][0] = 0.0;
    __return_storage_ptr__->x[1][3] = 0.0;
    __return_storage_ptr__->x[2][0] = 0.0;
    __return_storage_ptr__->x[0][3] = 0.0;
    __return_storage_ptr__->x[1][0] = 0.0;
    __return_storage_ptr__->x[0][1] = 0.0;
    __return_storage_ptr__->x[0][2] = 0.0;
    __return_storage_ptr__->x[0][0] = 1.0;
    __return_storage_ptr__->x[1][1] = 1.0;
    __return_storage_ptr__->x[2][2] = 1.0;
    __return_storage_ptr__->x[3][3] = 1.0;
  }
  else {
    auVar18 = ZEXT816(0);
    if (weights == (double *)0x0) {
      lVar4 = 0x10;
      auVar22 = ZEXT816(0);
      auVar21 = ZEXT816(0);
      sVar6 = numPoints;
      do {
        pdVar5 = (double *)((long)A + lVar4 + -0x10);
        dVar10 = auVar22._8_8_;
        auVar22._0_8_ = auVar22._0_8_ + *pdVar5;
        auVar22._8_8_ = dVar10 + pdVar5[1];
        pdVar5 = (double *)((long)B + lVar4 + -0x10);
        dVar10 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + *pdVar5;
        auVar18._8_8_ = dVar10 + pdVar5[1];
        dVar10 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + *(double *)((long)&B->x + lVar4);
        auVar21._8_8_ = dVar10 + *(double *)((long)&A->x + lVar4);
        lVar4 = lVar4 + 0x18;
        sVar6 = sVar6 - 1;
      } while (sVar6 != 0);
      auVar11._8_4_ = (int)(numPoints >> 0x20);
      auVar11._0_8_ = numPoints;
      auVar11._12_4_ = 0x45300000;
      dVar10 = (auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)numPoints) - 4503599627370496.0);
    }
    else {
      dVar10 = 0.0;
      lVar4 = 2;
      sVar6 = 0;
      auVar22 = ZEXT816(0);
      auVar21 = ZEXT816(0);
      do {
        dVar20 = weights[sVar6];
        dVar10 = dVar10 + dVar20;
        pdVar5 = (double *)((long)A + lVar4 * 8 + -0x10);
        dVar19 = auVar22._8_8_;
        auVar22._0_8_ = auVar22._0_8_ + *pdVar5 * dVar20;
        auVar22._8_8_ = dVar19 + pdVar5[1] * dVar20;
        pdVar5 = (double *)((long)B + lVar4 * 8 + -0x10);
        dVar19 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + *pdVar5 * dVar20;
        auVar18._8_8_ = dVar19 + pdVar5[1] * dVar20;
        dVar19 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + (&B->x)[lVar4] * dVar20;
        auVar21._8_8_ = dVar19 + (&A->x)[lVar4] * dVar20;
        sVar6 = sVar6 + 1;
        lVar4 = lVar4 + 3;
      } while (numPoints != sVar6);
    }
    if ((dVar10 != 0.0) || (NAN(dVar10))) {
      auVar1._8_8_ = dVar10;
      auVar1._0_8_ = dVar10;
      local_178 = divpd(auVar22,auVar1);
      auVar2._8_8_ = dVar10;
      auVar2._0_8_ = dVar10;
      auVar18 = divpd(auVar18,auVar2);
      auVar3._8_8_ = dVar10;
      auVar3._0_8_ = dVar10;
      auVar21 = divpd(auVar21,auVar3);
      local_188 = auVar21._8_8_;
      local_108 = 0.0;
      dStack_100 = 0.0;
      local_c8 = 0.0;
      dVar19 = auVar21._0_8_;
      dVar10 = auVar18._0_8_;
      dVar20 = auVar18._8_8_;
      if (weights == (double *)0x0) {
        lVar4 = 0x10;
        local_f8 = 0.0;
        dStack_f0 = 0.0;
        local_e8 = 0.0;
        dStack_e0 = 0.0;
        local_d8 = 0.0;
        dStack_d0 = 0.0;
        sVar6 = numPoints;
        do {
          dVar13 = *(double *)((long)&B->x + lVar4) - dVar19;
          dVar14 = *(double *)((long)&A->x + lVar4) - local_188;
          pdVar5 = (double *)((long)A + lVar4 + -0x10);
          dVar15 = *pdVar5 - local_178._0_8_;
          dVar12 = pdVar5[1] - local_178._8_8_;
          pdVar5 = (double *)((long)B + lVar4 + -0x10);
          dVar16 = *pdVar5 - dVar10;
          dVar17 = pdVar5[1] - dVar20;
          local_108 = local_108 + dVar16 * dVar15;
          dStack_100 = dStack_100 + dVar16 * dVar12;
          local_f8 = local_f8 + dVar14 * dVar16;
          dStack_f0 = dStack_f0 + dVar15 * dVar17;
          local_e8 = local_e8 + dVar12 * dVar17;
          dStack_e0 = dStack_e0 + dVar14 * dVar17;
          local_d8 = local_d8 + dVar13 * dVar15;
          dStack_d0 = dStack_d0 + dVar13 * dVar12;
          local_c8 = local_c8 + dVar14 * dVar13;
          lVar4 = lVar4 + 0x18;
          sVar6 = sVar6 - 1;
        } while (sVar6 != 0);
      }
      else {
        lVar4 = 2;
        sVar6 = 0;
        local_f8 = 0.0;
        dStack_f0 = 0.0;
        local_e8 = 0.0;
        dStack_e0 = 0.0;
        local_d8 = 0.0;
        dStack_d0 = 0.0;
        do {
          dVar15 = weights[sVar6];
          dVar12 = ((&B->x)[lVar4] - dVar19) * dVar15;
          dVar13 = (&A->x)[lVar4] - local_188;
          pdVar5 = (double *)((long)A + lVar4 * 8 + -0x10);
          dVar16 = *pdVar5 - local_178._0_8_;
          dVar17 = pdVar5[1] - local_178._8_8_;
          pdVar5 = (double *)((long)B + lVar4 * 8 + -0x10);
          dVar14 = dVar15 * (*pdVar5 - dVar10);
          dVar15 = dVar15 * (pdVar5[1] - dVar20);
          local_108 = local_108 + dVar14 * dVar16;
          dStack_100 = dStack_100 + dVar14 * dVar17;
          local_f8 = local_f8 + dVar13 * dVar14;
          dStack_f0 = dStack_f0 + dVar16 * dVar15;
          local_e8 = local_e8 + dVar17 * dVar15;
          dStack_e0 = dStack_e0 + dVar13 * dVar15;
          local_d8 = local_d8 + dVar12 * dVar16;
          dStack_d0 = dStack_d0 + dVar12 * dVar17;
          local_c8 = local_c8 + dVar13 * dVar12;
          sVar6 = sVar6 + 1;
          lVar4 = lVar4 + 3;
        } while (numPoints != sVar6);
      }
      A_00 = (double (*) [3])&local_108;
      local_150.x[1][0] = 0.0;
      lVar4 = 0;
      local_150.x[2][1] = 0.0;
      local_150.x[1][2] = 0.0;
      local_150.x[2][0] = 0.0;
      local_150.x[0][1] = 0.0;
      local_150.x[0][2] = 0.0;
      local_150.x[0][0] = 1.0;
      local_150.x[1][1] = 1.0;
      local_150.x[2][2] = 1.0;
      V_00 = (double (*) [3])&local_78;
      local_60 = 0;
      local_40 = 0;
      local_50 = 0;
      uStack_48 = 0;
      local_70 = 0.0;
      dStack_68 = 0.0;
      local_78 = 1.0;
      uStack_58 = 0x3ff0000000000000;
      local_38 = 0x3ff0000000000000;
      dStack_180 = local_188;
      jacobiSVD<double>((Matrix33<double> *)A_00,&local_150,&local_168,(Matrix33<double> *)V_00,
                        2.220446049250313e-16,true);
      local_c0 = local_150.x[0][0];
      local_b8 = local_150.x[1][0];
      local_b0 = local_150.x[2][0];
      local_a8 = local_150.x[0][1];
      local_a0 = local_150.x[1][1];
      local_98 = local_150.x[2][1];
      local_90 = local_150.x[0][2];
      local_88 = local_150.x[1][2];
      local_80 = local_150.x[2][2];
      local_1d8[8] = 0.0;
      local_1d8[6] = 0.0;
      local_1d8[7] = 0.0;
      local_1d8[4] = 0.0;
      local_1d8[5] = 0.0;
      local_1d8[2] = 0.0;
      local_1d8[3] = 0.0;
      local_1d8[0] = 0.0;
      local_1d8[1] = 0.0;
      do {
        lVar8 = 0;
        pdVar5 = &local_c0;
        do {
          dVar15 = local_1d8[lVar4 * 3 + lVar8];
          lVar9 = 0;
          pdVar7 = pdVar5;
          do {
            dVar15 = dVar15 + (*(double (*) [3])*V_00)[lVar9] * *pdVar7;
            lVar9 = lVar9 + 1;
            pdVar7 = pdVar7 + 3;
          } while (lVar9 != 3);
          local_1d8[lVar4 * 3 + lVar8] = dVar15;
          lVar8 = lVar8 + 1;
          pdVar5 = pdVar5 + 1;
        } while (lVar8 != 3);
        lVar4 = lVar4 + 1;
        V_00 = V_00 + 1;
      } while (lVar4 != 3);
      if (doScale && numPoints != 1) {
        if (weights == (double *)0x0) {
          pdVar5 = &A->z;
          dVar12 = 0.0;
          dVar15 = 0.0;
          do {
            dVar13 = ((Vec3<double> *)(pdVar5 + -2))->x - (double)local_178._0_8_;
            dVar12 = ((*pdVar5 - local_188) * (*pdVar5 - local_188) +
                     dVar13 * dVar13 +
                     (pdVar5[-1] - (double)local_178._8_8_) * (pdVar5[-1] - (double)local_178._8_8_)
                     ) - dVar12;
            dVar13 = dVar15 + dVar12;
            dVar12 = (dVar13 - dVar15) - dVar12;
            pdVar5 = pdVar5 + 3;
            numPoints = numPoints - 1;
            dVar15 = dVar13;
          } while (numPoints != 0);
        }
        else {
          pdVar5 = &A->z;
          sVar6 = 0;
          dVar12 = 0.0;
          dVar15 = 0.0;
          do {
            dVar13 = ((Vec3<double> *)(pdVar5 + -2))->x - (double)local_178._0_8_;
            dVar12 = ((*pdVar5 - local_188) * (*pdVar5 - local_188) +
                     dVar13 * dVar13 +
                     (pdVar5[-1] - (double)local_178._8_8_) * (pdVar5[-1] - (double)local_178._8_8_)
                     ) * weights[sVar6] - dVar12;
            dVar13 = dVar15 + dVar12;
            dVar12 = (dVar13 - dVar15) - dVar12;
            sVar6 = sVar6 + 1;
            pdVar5 = pdVar5 + 3;
            dVar15 = dVar13;
          } while (numPoints != sVar6);
        }
        dVar15 = 0.0;
        pdVar5 = local_1d8;
        lVar4 = 0;
        dVar12 = 0.0;
        do {
          lVar8 = 0;
          pdVar7 = pdVar5;
          dVar14 = dVar15;
          do {
            dVar12 = *pdVar7 * (*(double (*) [3])*A_00)[lVar8] - dVar12;
            dVar15 = dVar14 + dVar12;
            dVar12 = (dVar15 - dVar14) - dVar12;
            lVar8 = lVar8 + 1;
            pdVar7 = pdVar7 + 3;
            dVar14 = dVar15;
          } while (lVar8 != 3);
          lVar4 = lVar4 + 1;
          A_00 = A_00 + 1;
          pdVar5 = pdVar5 + 1;
        } while (lVar4 != 3);
        dVar15 = dVar15 / dVar13;
      }
      else {
        dVar15 = 1.0;
      }
      dVar13 = (double)local_178._0_8_ * dVar15;
      dVar12 = (double)local_178._8_8_ * dVar15;
      local_188 = local_188 * dVar15;
      __return_storage_ptr__->x[0][0] = dVar15 * local_1d8[0];
      __return_storage_ptr__->x[0][1] = dVar15 * local_1d8[1];
      __return_storage_ptr__->x[0][2] = local_1d8[2] * dVar15;
      __return_storage_ptr__->x[0][3] = 0.0;
      __return_storage_ptr__->x[1][0] = dVar15 * local_1d8[3];
      __return_storage_ptr__->x[1][1] = dVar15 * local_1d8[4];
      __return_storage_ptr__->x[1][2] = local_1d8[5] * dVar15;
      __return_storage_ptr__->x[1][3] = 0.0;
      __return_storage_ptr__->x[2][0] = dVar15 * local_1d8[6];
      __return_storage_ptr__->x[2][1] = dVar15 * local_1d8[7];
      __return_storage_ptr__->x[2][2] = local_1d8[8] * dVar15;
      __return_storage_ptr__->x[2][3] = 0.0;
      __return_storage_ptr__->x[3][0] =
           dVar10 - (local_188 * local_1d8[6] + dVar13 * local_1d8[0] + dVar12 * local_1d8[3]);
      __return_storage_ptr__->x[3][1] =
           dVar20 - (local_188 * local_1d8[7] + dVar13 * local_1d8[1] + dVar12 * local_1d8[4]);
      __return_storage_ptr__->x[3][2] =
           dVar19 - (local_188 * local_1d8[8] + dVar13 * local_1d8[2] + dVar12 * local_1d8[5]);
    }
    else {
      __return_storage_ptr__->x[1][1] = 0.0;
      __return_storage_ptr__->x[1][2] = 0.0;
      __return_storage_ptr__->x[2][1] = 0.0;
      __return_storage_ptr__->x[2][2] = 0.0;
      __return_storage_ptr__->x[3][1] = 0.0;
      __return_storage_ptr__->x[3][2] = 0.0;
      __return_storage_ptr__->x[2][3] = 0.0;
      __return_storage_ptr__->x[3][0] = 0.0;
      __return_storage_ptr__->x[1][3] = 0.0;
      __return_storage_ptr__->x[2][0] = 0.0;
      __return_storage_ptr__->x[0][3] = 0.0;
      __return_storage_ptr__->x[1][0] = 0.0;
      __return_storage_ptr__->x[0][1] = 0.0;
      __return_storage_ptr__->x[0][2] = 0.0;
      __return_storage_ptr__->x[0][0] = 1.0;
      __return_storage_ptr__->x[1][1] = 1.0;
      __return_storage_ptr__->x[2][2] = 1.0;
    }
    __return_storage_ptr__->x[3][3] = 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

M44d
procrustesRotationAndTranslation (const Vec3<T>* A, const Vec3<T>* B, const T* weights, const size_t numPoints, const bool doScale)
{
    if (numPoints == 0)
        return M44d();

    // Always do the accumulation in double precision:
    V3d Acenter (0.0);
    V3d Bcenter (0.0);
    double weightsSum = 0.0;

    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            Acenter += (V3d) A[i];
            Bcenter += (V3d) B[i];
        }
        weightsSum = (double) numPoints;
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            weightsSum += w;

            Acenter += w * (V3d) A[i];
            Bcenter += w * (V3d) B[i];
        }
    }

    if (weightsSum == 0)
        return M44d();

    Acenter /= weightsSum;
    Bcenter /= weightsSum;

    //
    // Find Q such that |Q*A - B|  (actually A-Acenter and B-Bcenter, weighted)
    // is minimized in the least squares sense.
    // From Golub/Van Loan, p.601
    //
    // A,B are 3xn
    // Let C = B A^T   (where A is 3xn and B^T is nx3, so C is 3x3)
    // Compute the SVD: C = U D V^T  (U,V rotations, D diagonal).
    // Throw away the D part, and return Q = U V^T
    M33d C (0.0);
    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
            C += outerProduct ((V3d) B[i] - Bcenter, (V3d) A[i] - Acenter);
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            C += outerProduct (w * ((V3d) B[i] - Bcenter), (V3d) A[i] - Acenter);
        }
    }

    M33d U, V;
    V3d S;
    jacobiSVD (C, U, S, V, IMATH_INTERNAL_NAMESPACE::limits<double>::epsilon(), true);

    // We want Q.transposed() here since we are going to be using it in the
    // Imath style (multiplying vectors on the right, v' = v*A^T):
    const M33d Qt = V * U.transposed();

    double s = 1.0;
    if (doScale && numPoints > 1)
    {
        // Finding a uniform scale: let us assume the Q is completely fixed
        // at this point (solving for both simultaneously seems much harder).  
        // We are trying to compute (again, per Golub and van Loan)
        //    min || s*A*Q - B ||_F
        // Notice that we've jammed a uniform scale in front of the Q.  
        // Now, the Frobenius norm (the least squares norm over matrices)
        // has the neat property that it is equivalent to minimizing the trace
        // of M^T*M (see your friendly neighborhood linear algebra text for a
        // derivation).  Thus, we can expand this out as
        //   min tr (s*A*Q - B)^T*(s*A*Q - B)
        // = min tr(Q^T*A^T*s*s*A*Q) + tr(B^T*B) - 2*tr(Q^T*A^T*s*B)  by linearity of the trace
        // = min s^2 tr(A^T*A) + tr(B^T*B) - 2*s*tr(Q^T*A^T*B)        using the fact that the trace is invariant
        //                                                            under similarity transforms Q*M*Q^T
        // If we differentiate w.r.t. s and set this to 0, we get
        // 0 = 2*s*tr(A^T*A) - 2*tr(Q^T*A^T*B)
        // so
        // 2*s*tr(A^T*A) = 2*s*tr(Q^T*A^T*B)
        // s = tr(Q^T*A^T*B) / tr(A^T*A)

        KahanSum traceATA;
        if (weights == 0)
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA += ((V3d) A[i] - Acenter).length2();
        }
        else
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA += ((double) weights[i]) * ((V3d) A[i] - Acenter).length2();
        }

        KahanSum traceBATQ;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                traceBATQ += Qt[j][i] * C[i][j];

        s = traceBATQ.get() / traceATA.get();
    }

    // Q is the rotation part of what we want to return.
    // The entire transform is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin)
    //                last                                first
    // The effect of this on a point is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin) * point
    //  = (translate origin to Bcenter) * Q * (-Acenter + point)
    //  = (translate origin to Bcenter) * (-Q*Acenter + Q*point)
    //  = (translate origin to Bcenter) * (translate Q*Acenter to origin) * Q*point
    //  = (translate Q*Acenter to Bcenter) * Q*point
    // So what we want to return is:
    //    (translate Q*Acenter to Bcenter) * Q
    //
    // In block form, this is:
    //   [ 1 0 0  | ] [       0 ] [ 1 0 0  |  ]   [ 1 0 0  | ] [           |   ]   [                 ]
    //   [ 0 1 0 tb ] [  s*Q  0 ] [ 0 1 0 -ta ] = [ 0 1 0 tb ] [  s*Q  -s*Q*ta ] = [   Q   tb-s*Q*ta ]
    //   [ 0 0 1  | ] [       0 ] [ 0 0 1  |  ]   [ 0 0 1  | ] [           |   ]   [                 ]
    //   [ 0 0 0  1 ] [ 0 0 0 1 ] [ 0 0 0  1  ]   [ 0 0 0  1 ] [ 0 0 0     1   ]   [ 0 0 0    1      ]
    // (ofc the whole thing is transposed for Imath).  
    const V3d translate = Bcenter - s*Acenter*Qt;

    return M44d (s*Qt.x[0][0], s*Qt.x[0][1], s*Qt.x[0][2], T(0),
                 s*Qt.x[1][0], s*Qt.x[1][1], s*Qt.x[1][2], T(0),
                 s*Qt.x[2][0], s*Qt.x[2][1], s*Qt.x[2][2], T(0),
                 translate.x, translate.y, translate.z, T(1));
}